

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

wchar_t textui_do_birth(void)

{
  byte bVar1;
  cmd_code local_2c;
  menu_conflict *pmStack_28;
  cmd_code command;
  menu_conflict *menu;
  birth_stage local_18;
  birth_stage bStack_14;
  _Bool done;
  birth_stage next;
  birth_stage roller;
  birth_stage prev;
  birth_stage current_stage;
  
  roller = BIRTH_RESET;
  next = BIRTH_BACK;
  bStack_14 = BIRTH_RESET;
  bVar1 = 0;
  cmdq_push(CMD_BIRTH_INIT);
  cmdq_execute(CTX_BIRTH);
  while ((bool)(bVar1 ^ 1)) {
    local_18 = roller;
    switch(roller) {
    case BIRTH_RESET:
      cmdq_push(CMD_BIRTH_RESET);
      bStack_14 = BIRTH_RESET;
      if ((quickstart_allowed & 1U) == 0) {
        local_18 = BIRTH_MAP_CHOICE;
      }
      else {
        local_18 = BIRTH_QUICKSTART;
      }
      break;
    case BIRTH_QUICKSTART:
      display_player(L'\0');
      local_18 = textui_birth_quickstart();
      if (local_18 == BIRTH_COMPLETE) {
        bVar1 = 1;
      }
      break;
    case BIRTH_MAP_CHOICE:
      print_map_instructions();
      local_18 = get_map_command();
      if (local_18 == BIRTH_BACK) {
        local_18 = BIRTH_RESET;
      }
      break;
    case BIRTH_RACE_CHOICE:
    case BIRTH_CLASS_CHOICE:
    case BIRTH_ROLLER_CHOICE:
      pmStack_28 = &race_menu;
      local_2c = CMD_CHOOSE_RACE;
      Term_clear();
      print_menu_instructions();
      if (BIRTH_RACE_CHOICE < roller) {
        menu_refresh(&race_menu,false);
        pmStack_28 = &class_menu;
        local_2c = CMD_CHOOSE_CLASS;
      }
      if (BIRTH_CLASS_CHOICE < roller) {
        menu_refresh(&class_menu,false);
        pmStack_28 = &roller_menu;
      }
      local_18 = menu_question(roller,pmStack_28,local_2c);
      if (local_18 == BIRTH_BACK) {
        local_18 = roller + BIRTH_BACK;
      }
      if (local_18 == BIRTH_QUICKSTART) {
        local_18 = BIRTH_RESET;
      }
      break;
    case BIRTH_POINTBASED:
      bStack_14 = BIRTH_POINTBASED;
      if (BIRTH_POINTBASED < next) {
        point_based_start();
        cmdq_push(CMD_REFRESH_STATS);
        cmdq_execute(CTX_BIRTH);
      }
      local_18 = point_based_command();
      if (local_18 == BIRTH_BACK) {
        local_18 = BIRTH_ROLLER_CHOICE;
      }
      if (local_18 != BIRTH_POINTBASED) {
        point_based_stop();
      }
      break;
    case BIRTH_ROLLER:
      bStack_14 = BIRTH_ROLLER;
      local_18 = roller_command(next < BIRTH_ROLLER);
      if (local_18 == BIRTH_BACK) {
        local_18 = BIRTH_ROLLER_CHOICE;
      }
      break;
    case BIRTH_NAME_CHOICE:
      if (next < BIRTH_NAME_CHOICE) {
        display_player(L'\0');
      }
      local_18 = get_name_command();
      if (local_18 == BIRTH_BACK) {
        local_18 = bStack_14;
      }
      break;
    case BIRTH_HISTORY_CHOICE:
      if (next < BIRTH_HISTORY_CHOICE) {
        display_player(L'\0');
      }
      local_18 = get_history_command();
      if (local_18 == BIRTH_BACK) {
        local_18 = BIRTH_NAME_CHOICE;
      }
      break;
    case BIRTH_FINAL_CONFIRM:
      if (next < BIRTH_FINAL_CONFIRM) {
        display_player(L'\0');
      }
      local_18 = get_confirm_command();
      if (local_18 == BIRTH_BACK) {
        local_18 = BIRTH_HISTORY_CHOICE;
      }
      if (local_18 == BIRTH_COMPLETE) {
        bVar1 = 1;
      }
    }
    next = roller;
    roller = local_18;
    cmdq_execute(CTX_BIRTH);
  }
  return L'\0';
}

Assistant:

int textui_do_birth(void)
{
	enum birth_stage current_stage = BIRTH_RESET;
	enum birth_stage prev = BIRTH_BACK;
	enum birth_stage roller = BIRTH_RESET;
	enum birth_stage next = current_stage;

	bool done = false;

	cmdq_push(CMD_BIRTH_INIT);
	cmdq_execute(CTX_BIRTH);

	while (!done) {

		switch (current_stage)
		{
			case BIRTH_RESET:
			{
				cmdq_push(CMD_BIRTH_RESET);

				roller = BIRTH_RESET;
				
				if (quickstart_allowed)
					next = BIRTH_QUICKSTART;
				else
					next = BIRTH_MAP_CHOICE;

				break;
			}

			case BIRTH_QUICKSTART:
			{
				display_player(0);
				next = textui_birth_quickstart();
				if (next == BIRTH_COMPLETE)
					done = true;
				break;
			}

			case BIRTH_MAP_CHOICE:
			{
				print_map_instructions();
				next = get_map_command();
				if (next == BIRTH_BACK)
					next = BIRTH_RESET;
				break;
			}

			case BIRTH_CLASS_CHOICE:
			case BIRTH_RACE_CHOICE:
			case BIRTH_ROLLER_CHOICE:
			{
				struct menu *menu = &race_menu;
				cmd_code command = CMD_CHOOSE_RACE;

				Term_clear();
				print_menu_instructions();

				if (current_stage > BIRTH_RACE_CHOICE) {
					menu_refresh(&race_menu, false);
					menu = &class_menu;
					command = CMD_CHOOSE_CLASS;
				}

				if (current_stage > BIRTH_CLASS_CHOICE) {
					menu_refresh(&class_menu, false);
					menu = &roller_menu;
				}

				next = menu_question(current_stage, menu, command);

				if (next == BIRTH_BACK)
					next = current_stage - 1;

				/* Make sure the character gets reset before quickstarting */
				if (next == BIRTH_QUICKSTART) 
					next = BIRTH_RESET;

				break;
			}

			case BIRTH_POINTBASED:
			{
				roller = BIRTH_POINTBASED;
		
				if (prev > BIRTH_POINTBASED) {
					point_based_start();
					/*
					 * Force a redraw of the point
					 * allocations but do not reset them.
					 */
					cmdq_push(CMD_REFRESH_STATS);
					cmdq_execute(CTX_BIRTH);
				}

				next = point_based_command();

				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				if (next != BIRTH_POINTBASED)
					point_based_stop();

				break;
			}

			case BIRTH_ROLLER:
			{
				roller = BIRTH_ROLLER;
				next = roller_command(prev < BIRTH_ROLLER);
				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				break;
			}

			case BIRTH_NAME_CHOICE:
			{
				if (prev < BIRTH_NAME_CHOICE)
					display_player(0);

				next = get_name_command();
				if (next == BIRTH_BACK)
					next = roller;

				break;
			}

			case BIRTH_HISTORY_CHOICE:
			{
				if (prev < BIRTH_HISTORY_CHOICE)
					display_player(0);

				next = get_history_command();
				if (next == BIRTH_BACK)
					next = BIRTH_NAME_CHOICE;

				break;
			}

			case BIRTH_FINAL_CONFIRM:
			{
				if (prev < BIRTH_FINAL_CONFIRM)
					display_player(0);

				next = get_confirm_command();
				if (next == BIRTH_BACK)
					next = BIRTH_HISTORY_CHOICE;

				if (next == BIRTH_COMPLETE)
					done = true;

				break;
			}

			default:
			{
				/* Remove dodgy compiler warning, */
			}
		}

		prev = current_stage;
		current_stage = next;

		/* Execute whatever commands have been sent */
		cmdq_execute(CTX_BIRTH);
	}

	return 0;
}